

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O3

ssize_t zip_entry_noallocreadwithoffset(zip_t *zip,size_t offset,size_t size,void *buf)

{
  ulong uVar1;
  long lVar2;
  mz_zip_reader_extract_iter_state *pState;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ssize_t sVar8;
  ulong __n;
  ulong local_58;
  
  if (zip == (zip_t *)0x0) {
    sVar8 = -1;
  }
  else {
    uVar4 = (zip->entry).uncomp_size;
    sVar8 = -0x21;
    if (offset <= uVar4 && uVar4 - offset != 0) {
      uVar5 = uVar4 - offset;
      if (size + offset <= uVar4) {
        uVar5 = size;
      }
      sVar8 = -3;
      if (((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING) &&
         (lVar2 = (zip->entry).index, -1 < lVar2)) {
        pState = mz_zip_reader_extract_iter_new(&zip->archive,(mz_uint)lVar2,0);
        if (pState == (mz_zip_reader_extract_iter_state *)0x0) {
          sVar8 = -0x22;
        }
        else {
          sVar8 = 0;
          if (uVar5 != 0 && (zip->entry).uncomp_size != 0) {
            uVar4 = uVar5;
            uVar6 = 0;
            local_58 = offset;
            while( true ) {
              sVar3 = mz_zip_reader_extract_iter_read(pState,(void *)((long)buf + sVar8),uVar4);
              if (sVar3 == 0) break;
              uVar1 = sVar3 + uVar6;
              if (local_58 < uVar1) {
                uVar7 = local_58 - uVar6;
                if (uVar5 <= uVar7) {
                  __assert_fail("read_cursor < size",
                                "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/zip.c"
                                ,0x6a8,
                                "ssize_t zip_entry_noallocreadwithoffset(struct zip_t *, size_t, size_t, void *)"
                               );
                }
                __n = sVar3 - uVar7;
                if (uVar4 < sVar3 - uVar7) {
                  __n = uVar4;
                }
                if (uVar5 < __n) {
                  __assert_fail("read_size <= size",
                                "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/zip.c"
                                ,0x6ad,
                                "ssize_t zip_entry_noallocreadwithoffset(struct zip_t *, size_t, size_t, void *)"
                               );
                }
                if (local_58 != uVar6) {
                  memmove((void *)((long)buf + sVar8),(void *)(uVar7 + (long)buf),__n);
                }
                sVar8 = sVar8 + __n;
                local_58 = local_58 + __n;
                uVar4 = uVar4 - __n;
              }
              if (((zip->entry).uncomp_size <= uVar1) || (uVar6 = uVar1, uVar4 == 0)) break;
            }
          }
          mz_zip_reader_extract_iter_free(pState);
        }
      }
    }
  }
  return sVar8;
}

Assistant:

ssize_t zip_entry_noallocreadwithoffset(struct zip_t *zip, size_t offset,
                                        size_t size, void *buf) {
  mz_zip_archive *pzip = NULL;

  if (!zip) {
    // zip_t handler is not initialized
    return (ssize_t)ZIP_ENOINIT;
  }

  if (offset >= (size_t)zip->entry.uncomp_size) {
    return (ssize_t)ZIP_EINVAL;
  }

  if ((offset + size) > (size_t)zip->entry.uncomp_size) {
    size = (ssize_t)zip->entry.uncomp_size - offset;
  }

  pzip = &(zip->archive);
  if (pzip->m_zip_mode != MZ_ZIP_MODE_READING ||
      zip->entry.index < (ssize_t)0) {
    // the entry is not found or we do not have read access
    return (ssize_t)ZIP_ENOENT;
  }

  mz_zip_reader_extract_iter_state *iter =
      mz_zip_reader_extract_iter_new(pzip, (mz_uint)zip->entry.index, 0);
  if (!iter) {
    return (ssize_t)ZIP_ENORITER;
  }

  mz_uint8 *writebuf = (mz_uint8 *)buf;
  size_t file_offset = 0;
  size_t write_cursor = 0;
  size_t to_read = size;

  // iterate until the requested offset is in range
  while (file_offset < zip->entry.uncomp_size && to_read > 0) {
    size_t nread = mz_zip_reader_extract_iter_read(
        iter, (void *)&writebuf[write_cursor], to_read);

    if (nread == 0)
      break;

    if (offset < (file_offset + nread)) {
      size_t read_cursor = offset - file_offset;
      MZ_ASSERT(read_cursor < size);
      size_t read_size = nread - read_cursor;

      if (to_read < read_size)
        read_size = to_read;
      MZ_ASSERT(read_size <= size);

      // If it's an unaligned read (i.e. the first one)
      if (read_cursor != 0) {
        memmove(&writebuf[write_cursor], &writebuf[read_cursor], read_size);
      }

      write_cursor += read_size;
      offset += read_size;
      to_read -= read_size;
    }

    file_offset += nread;
  }

  mz_zip_reader_extract_iter_free(iter);
  return (ssize_t)write_cursor;
}